

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

Slice __thiscall jbcoin::SerialIter::getSlice(SerialIter *this,size_t bytes)

{
  size_t bytes_local;
  SerialIter *this_local;
  Slice s;
  
  if (this->remain_ < bytes) {
    Throw<std::runtime_error,char_const(&)[28]>((char (*) [28])"invalid SerialIter getSlice");
  }
  Slice::Slice((Slice *)&this_local,this->p_,bytes);
  this->p_ = this->p_ + bytes;
  this->used_ = this->used_ + bytes;
  this->remain_ = this->remain_ - bytes;
  return _this_local;
}

Assistant:

Slice
SerialIter::getSlice (std::size_t bytes)
{
    if (bytes > remain_)
        Throw<std::runtime_error> (
            "invalid SerialIter getSlice");
    Slice s(p_, bytes);
    p_ += bytes;
    used_ += bytes;
    remain_ -= bytes;
    return s;
}